

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void negotiate(connectdata *conn)

{
  HTTP *pHVar1;
  TELNET *tn;
  int i;
  connectdata *conn_local;
  
  pHVar1 = (conn->data->state).proto.http;
  for (tn._4_4_ = 0; tn._4_4_ < 0x28; tn._4_4_ = tn._4_4_ + 1) {
    if (tn._4_4_ != 1) {
      if (*(int *)((long)&pHVar1[0xf].postdata + (long)tn._4_4_ * 4) == 1) {
        set_local_option(conn,tn._4_4_,1);
      }
      if (*(int *)((long)&pHVar1[0x25].backup.fread_in + (long)tn._4_4_ * 4) == 1) {
        set_remote_option(conn,tn._4_4_,1);
      }
    }
  }
  return;
}

Assistant:

static void negotiate(struct connectdata *conn)
{
  int i;
  struct TELNET *tn = (struct TELNET *) conn->data->state.proto.telnet;

  for(i = 0;i < CURL_NTELOPTS;i++) {
    if(i==CURL_TELOPT_ECHO)
      continue;

    if(tn->us_preferred[i] == CURL_YES)
      set_local_option(conn, i, CURL_YES);

    if(tn->him_preferred[i] == CURL_YES)
      set_remote_option(conn, i, CURL_YES);
  }
}